

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::bufferCollection::init
          (bufferCollection *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppfVar1;
  uint uVar2;
  uint uVar3;
  GLuint width;
  GLuint height;
  byte bVar4;
  uint n_layers_00;
  int extraout_EAX;
  reference pvVar5;
  reference pvVar6;
  GLuint *in_RCX;
  GLuint refZ_offset;
  GLuint grad_offset;
  GLuint lods_offset;
  GLuint texture_coordinates_offset;
  GLuint position_offset;
  GLuint face;
  GLfloat layer_coordinate;
  GLuint layer;
  undefined1 local_110 [8];
  vector<float,_std::allocator<float>_> refZ_buffer_data;
  vector<float,_std::allocator<float>_> grad_y_buffer_data;
  vector<float,_std::allocator<float>_> grad_x_buffer_data;
  vector<float,_std::allocator<float>_> lod_buffer_data;
  vector<float,_std::allocator<float>_> texture_coordinate_for_gather_buffer_data;
  vector<float,_std::allocator<float>_> texture_coordinate_buffer_data;
  vector<float,_std::allocator<float>_> position_buffer_data;
  GLuint n_mip_map_levels;
  GLuint texture_height;
  GLuint texture_width;
  GLuint n_refZ_step_per_layer;
  GLuint n_grad_step_per_layer;
  GLuint n_lods_step_per_layer;
  GLuint n_texture_coordinates_step_per_layer;
  GLuint n_position_step_per_layer;
  GLuint n_refZ_step_per_face;
  GLuint n_grad_step_per_face;
  GLuint n_lods_step_per_face;
  GLuint n_texture_coordinates_step_per_face;
  GLuint n_position_step_per_face;
  GLuint n_total_points;
  GLuint n_points_per_layer;
  GLuint n_layers;
  resolutionDefinition *resolution_local;
  formatDefinition *format_local;
  Functions *gl_local;
  bufferCollection *this_local;
  
  n_layers_00 = in_RCX[2] / 6;
  width = *in_RCX;
  height = in_RCX[1];
  bVar4 = getMipmapLevelCount(width,height);
  ppfVar1 = &texture_coordinate_buffer_data.super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)ppfVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &texture_coordinate_for_gather_buffer_data.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &lod_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &grad_x_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &grad_y_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &refZ_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_110);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)ppfVar1,(ulong)(n_layers_00 * 0xd8));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &texture_coordinate_for_gather_buffer_data.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(ulong)(n_layers_00 * 0xd8));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &lod_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)(n_layers_00 * 0xd8));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &grad_x_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)(n_layers_00 * 0x36));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &grad_y_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)(n_layers_00 * 0xd8));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             &refZ_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ulong)(n_layers_00 * 0xd8));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)local_110,(ulong)(n_layers_00 * 0x36));
  for (face = 0; face < n_layers_00; face = face + 1) {
    for (texture_coordinates_offset = 0; texture_coordinates_offset < 6;
        texture_coordinates_offset = texture_coordinates_offset + 1) {
      uVar2 = face * 0xd8 + texture_coordinates_offset * 0x24;
      uVar3 = face * 0xd8 + texture_coordinates_offset * 0x24;
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &texture_coordinate_buffer_data.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      preparePositionForFace
                (pvVar5 + (face * 0xd8 + texture_coordinates_offset * 0x24),
                 texture_coordinates_offset,face,n_layers_00 * 6);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &texture_coordinate_for_gather_buffer_data.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      prepareTextureCoordinatesForFace
                (pvVar5 + uVar2,width,height,(float)face,texture_coordinates_offset);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &lod_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,0);
      prepareTextureCoordinatesForGatherForFace
                (pvVar5 + uVar2,width,height,(float)face,texture_coordinates_offset);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &grad_x_buffer_data.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      prepareLodForFace(pvVar5 + (face * 0x36 + texture_coordinates_offset * 9),(uint)bVar4);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &grad_y_buffer_data.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &texture_coordinate_for_gather_buffer_data.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      prepareGradXForFace(pvVar5 + uVar3,texture_coordinates_offset,pvVar6 + uVar2,width);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &refZ_buffer_data.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,0);
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &texture_coordinate_for_gather_buffer_data.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      prepareGradYForFace(pvVar5 + uVar3,texture_coordinates_offset,pvVar6 + uVar2,width);
      pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)local_110,0);
      prepareRefZForFace(pvVar5 + (face * 0x36 + texture_coordinates_offset * 9),(uint)bVar4,
                         texture_coordinates_offset,face,n_layers_00);
    }
  }
  ppfVar1 = &texture_coordinate_buffer_data.super__Vector_base<float,_std::allocator<float>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::size((vector<float,_std::allocator<float>_> *)ppfVar1)
  ;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
  bufferDefinition::init(&this->postion,ctx);
  ppfVar1 = &texture_coordinate_for_gather_buffer_data.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::size((vector<float,_std::allocator<float>_> *)ppfVar1)
  ;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
  bufferDefinition::init(&this->texture_coordinate,ctx);
  ppfVar1 = &lod_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::size((vector<float,_std::allocator<float>_> *)ppfVar1)
  ;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
  bufferDefinition::init(&this->texture_coordinate_for_gather,ctx);
  ppfVar1 = &grad_x_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::size((vector<float,_std::allocator<float>_> *)ppfVar1)
  ;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
  bufferDefinition::init(&this->lod,ctx);
  ppfVar1 = &grad_y_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::size((vector<float,_std::allocator<float>_> *)ppfVar1)
  ;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
  bufferDefinition::init(&this->grad_x,ctx);
  ppfVar1 = &refZ_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::size((vector<float,_std::allocator<float>_> *)ppfVar1)
  ;
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
  bufferDefinition::init(&this->grad_y,ctx);
  std::vector<float,_std::allocator<float>_>::size
            ((vector<float,_std::allocator<float>_> *)local_110);
  std::vector<float,_std::allocator<float>_>::operator[]
            ((vector<float,_std::allocator<float>_> *)local_110,0);
  bufferDefinition::init(&this->refZ,ctx);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_110);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &refZ_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &grad_y_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &grad_x_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &lod_buffer_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &texture_coordinate_for_gather_buffer_data.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &texture_coordinate_buffer_data.super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return extraout_EAX;
}

Assistant:

void TextureCubeMapArraySamplingTest::bufferCollection::init(const glw::Functions& gl, const formatDefinition& format,
															 const resolutionDefinition& resolution)
{
	(void)format;

	static const glw::GLuint n_faces						  = 6;
	static const glw::GLuint n_lods_components				  = 1;
	static const glw::GLuint n_grad_components				  = 4;
	static const glw::GLuint n_points_per_face				  = 9;
	static const glw::GLuint n_position_components			  = 4;
	static const glw::GLuint n_refZ_components				  = 1;
	static const glw::GLuint n_texture_coordinates_components = 4;

	const glw::GLuint n_layers = resolution.m_depth / n_faces;

	const glw::GLuint n_points_per_layer = n_points_per_face * n_faces;
	const glw::GLuint n_total_points	 = n_points_per_layer * n_layers;

	const glw::GLuint n_position_step_per_face			  = n_position_components * n_points_per_face;
	const glw::GLuint n_texture_coordinates_step_per_face = n_texture_coordinates_components * n_points_per_face;
	const glw::GLuint n_lods_step_per_face				  = n_lods_components * n_points_per_face;
	const glw::GLuint n_grad_step_per_face				  = n_grad_components * n_points_per_face;
	const glw::GLuint n_refZ_step_per_face				  = n_refZ_components * n_points_per_face;

	const glw::GLuint n_position_step_per_layer			   = n_faces * n_position_step_per_face;
	const glw::GLuint n_texture_coordinates_step_per_layer = n_faces * n_texture_coordinates_step_per_face;
	const glw::GLuint n_lods_step_per_layer				   = n_faces * n_lods_step_per_face;
	const glw::GLuint n_grad_step_per_layer				   = n_faces * n_grad_step_per_face;
	const glw::GLuint n_refZ_step_per_layer				   = n_faces * n_refZ_step_per_face;

	const glw::GLuint texture_width	= resolution.m_width;
	const glw::GLuint texture_height   = resolution.m_height;
	const glw::GLuint n_mip_map_levels = getMipmapLevelCount(texture_width, texture_height);

	std::vector<glw::GLfloat> position_buffer_data;
	std::vector<glw::GLfloat> texture_coordinate_buffer_data;
	std::vector<glw::GLfloat> texture_coordinate_for_gather_buffer_data;
	std::vector<glw::GLfloat> lod_buffer_data;
	std::vector<glw::GLfloat> grad_x_buffer_data;
	std::vector<glw::GLfloat> grad_y_buffer_data;
	std::vector<glw::GLfloat> refZ_buffer_data;

	position_buffer_data.resize(n_total_points * n_position_components);
	texture_coordinate_buffer_data.resize(n_total_points * n_texture_coordinates_components);
	texture_coordinate_for_gather_buffer_data.resize(n_total_points * n_texture_coordinates_components);
	lod_buffer_data.resize(n_total_points * n_lods_components);
	grad_x_buffer_data.resize(n_total_points * n_grad_components);
	grad_y_buffer_data.resize(n_total_points * n_grad_components);
	refZ_buffer_data.resize(n_total_points * n_refZ_components);

	/* Prepare data */
	for (glw::GLuint layer = 0; layer < n_layers; ++layer)
	{
		const glw::GLfloat layer_coordinate = (float)layer;

		for (glw::GLuint face = 0; face < n_faces; ++face)
		{
			/* Offsets */
			const glw::GLuint position_offset = layer * n_position_step_per_layer + face * n_position_step_per_face;
			const glw::GLuint texture_coordinates_offset =
				layer * n_texture_coordinates_step_per_layer + face * n_texture_coordinates_step_per_face;
			const glw::GLuint lods_offset = layer * n_lods_step_per_layer + face * n_lods_step_per_face;
			const glw::GLuint grad_offset = layer * n_grad_step_per_layer + face * n_grad_step_per_face;
			const glw::GLuint refZ_offset = layer * n_refZ_step_per_layer + face * n_refZ_step_per_face;

			/* Prepare data */
			preparePositionForFace(&position_buffer_data[0] + position_offset, face, layer, n_layers * n_faces);
			prepareTextureCoordinatesForFace(&texture_coordinate_buffer_data[0] + texture_coordinates_offset,
											 texture_width, texture_height, layer_coordinate, face);
			prepareTextureCoordinatesForGatherForFace(&texture_coordinate_for_gather_buffer_data[0] +
														  texture_coordinates_offset,
													  texture_width, texture_height, layer_coordinate, face);
			prepareLodForFace(&lod_buffer_data[0] + lods_offset, n_mip_map_levels);
			prepareGradXForFace(&grad_x_buffer_data[0] + grad_offset, face,
								&texture_coordinate_buffer_data[0] + texture_coordinates_offset, texture_width);
			prepareGradYForFace(&grad_y_buffer_data[0] + grad_offset, face,
								&texture_coordinate_buffer_data[0] + texture_coordinates_offset, texture_width);
			prepareRefZForFace(&refZ_buffer_data[0] + refZ_offset, n_mip_map_levels, face, layer, n_layers);
		}
	}

	/* Initialize buffers */
	postion.init(gl, (glw::GLsizeiptr)(position_buffer_data.size() * sizeof(glw::GLfloat)), &position_buffer_data[0]);
	texture_coordinate.init(gl, (glw::GLsizeiptr)(texture_coordinate_buffer_data.size() * sizeof(glw::GLfloat)),
							&texture_coordinate_buffer_data[0]);
	texture_coordinate_for_gather.init(
		gl, (glw::GLsizeiptr)(texture_coordinate_for_gather_buffer_data.size() * sizeof(glw::GLfloat)),
		&texture_coordinate_for_gather_buffer_data[0]);
	lod.init(gl, (glw::GLsizeiptr)(lod_buffer_data.size() * sizeof(glw::GLfloat)), &lod_buffer_data[0]);
	grad_x.init(gl, (glw::GLsizeiptr)(grad_x_buffer_data.size() * sizeof(glw::GLfloat)), &grad_x_buffer_data[0]);
	grad_y.init(gl, (glw::GLsizeiptr)(grad_y_buffer_data.size() * sizeof(glw::GLfloat)), &grad_y_buffer_data[0]);
	refZ.init(gl, (glw::GLsizeiptr)(refZ_buffer_data.size() * sizeof(glw::GLfloat)), &refZ_buffer_data[0]);
}